

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O0

labsEndpoint_t *
ssllabs::Endpoint::parseEndpointData
          (labsEndpoint_t *__return_storage_ptr__,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *obj)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *obj_local;
  labsEndpoint_t *endpoint;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->ServerName);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->StatusMessage);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->StatusDetailMessage);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->Grade);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->GradeTrustIgnored);
  __return_storage_ptr__->HasWarnings = false;
  __return_storage_ptr__->IsExceptional = false;
  __return_storage_ptr__->Progress = 0;
  __return_storage_ptr__->Duration = 0;
  __return_storage_ptr__->Eta = 0;
  __return_storage_ptr__->Delegation = 0;
  (__return_storage_ptr__->Details).HostStartTime = 0;
  (__return_storage_ptr__->Details).Key.Size = 0;
  (__return_storage_ptr__->Details).Key.Strength = 0;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Key.Algorithm);
  (__return_storage_ptr__->Details).Key.DebianFlaw = false;
  (__return_storage_ptr__->Details).Key.Q = 0;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Cert);
  (__return_storage_ptr__->Details).Cert.CommonNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CommonNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CommonNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->Details).Cert.CommonNames);
  (__return_storage_ptr__->Details).Cert.AltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.AltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.AltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->Details).Cert.AltNames);
  (__return_storage_ptr__->Details).Cert.NotBefore = 0;
  (__return_storage_ptr__->Details).Cert.NotAfter = 0;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Cert.IssuerSubject);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Cert.SigAlg);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Cert.IssuerLabel);
  (__return_storage_ptr__->Details).Cert.RevocationInfo = 0;
  (__return_storage_ptr__->Details).Cert.CrlURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CrlURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.CrlURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->Details).Cert.CrlURIs);
  (__return_storage_ptr__->Details).Cert.OcspURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.OcspURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Cert.OcspURIs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->Details).Cert.OcspURIs);
  (__return_storage_ptr__->Details).Cert.RevocationStatus = 0;
  (__return_storage_ptr__->Details).Cert.CrlRevocationStatus = 0;
  (__return_storage_ptr__->Details).Cert.OcspRevocationStatus = 0;
  (__return_storage_ptr__->Details).Cert.Sgc = 0;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Cert.ValidationType);
  (__return_storage_ptr__->Details).Cert.Issues = 0;
  (__return_storage_ptr__->Details).Cert.Sct = false;
  (__return_storage_ptr__->Details).Cert.MustStaple = 0;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Cert.Sha1Hash);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).Cert.PinSha256);
  (__return_storage_ptr__->Details).Chain.Certs.
  super__Vector_base<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Chain.Certs.
  super__Vector_base<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Chain.Certs.
  super__Vector_base<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsChainCert,_std::allocator<ssllabs::labsChainCert>_>::vector
            (&(__return_storage_ptr__->Details).Chain.Certs);
  (__return_storage_ptr__->Details).Chain.Issues = 0;
  (__return_storage_ptr__->Details).Protocols.
  super__Vector_base<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Protocols.
  super__Vector_base<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Protocols.
  super__Vector_base<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>::vector
            (&(__return_storage_ptr__->Details).Protocols);
  (__return_storage_ptr__->Details).Suites.List.
  super__Vector_base<ssllabs::labsSuite,_std::allocator<ssllabs::labsSuite>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Suites.List.
  super__Vector_base<ssllabs::labsSuite,_std::allocator<ssllabs::labsSuite>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Suites.List.
  super__Vector_base<ssllabs::labsSuite,_std::allocator<ssllabs::labsSuite>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsSuite,_std::allocator<ssllabs::labsSuite>_>::vector
            (&(__return_storage_ptr__->Details).Suites.List);
  (__return_storage_ptr__->Details).Suites.Preference = false;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).ServerSignature);
  (__return_storage_ptr__->Details).PrefixDelegation = false;
  (__return_storage_ptr__->Details).NonPrefixDelegation = false;
  (__return_storage_ptr__->Details).VulnBeast = false;
  (__return_storage_ptr__->Details).RenegSupport = 0;
  (__return_storage_ptr__->Details).SessionResumption = 0;
  (__return_storage_ptr__->Details).CompressionMethods = 0;
  (__return_storage_ptr__->Details).SupportsNpn = false;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).NpnProtocols);
  (__return_storage_ptr__->Details).SessionTickets = 0;
  (__return_storage_ptr__->Details).OcspStapling = false;
  (__return_storage_ptr__->Details).StaplingRevocationStatus = 0;
  std::__cxx11::string::string
            ((string *)&(__return_storage_ptr__->Details).StaplingRevocationErrorMessage);
  (__return_storage_ptr__->Details).SniRequired = false;
  (__return_storage_ptr__->Details).HttpStatusCode = 0;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HttpForwarding);
  (__return_storage_ptr__->Details).ForwardSecrecy = 0;
  (__return_storage_ptr__->Details).SupportsRc4 = false;
  (__return_storage_ptr__->Details).Rc4WithModern = false;
  (__return_storage_ptr__->Details).Rc4Only = false;
  (__return_storage_ptr__->Details).Sims.Results.
  super__Vector_base<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).Sims.Results.
  super__Vector_base<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).Sims.Results.
  super__Vector_base<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsSimulation,_std::allocator<ssllabs::labsSimulation>_>::vector
            (&(__return_storage_ptr__->Details).Sims.Results);
  (__return_storage_ptr__->Details).Heartbleed = false;
  (__return_storage_ptr__->Details).Heartbeat = false;
  (__return_storage_ptr__->Details).OpenSslCcs = 0;
  (__return_storage_ptr__->Details).Poodle = false;
  (__return_storage_ptr__->Details).PoodleTls = 0;
  (__return_storage_ptr__->Details).FallbackScsv = false;
  (__return_storage_ptr__->Details).Freak = false;
  (__return_storage_ptr__->Details).HasSct = 0;
  (__return_storage_ptr__->Details).DhPrimes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).DhPrimes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).DhPrimes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->Details).DhPrimes);
  (__return_storage_ptr__->Details).DhUsesKnownPrimes = 0;
  (__return_storage_ptr__->Details).DhYsReuse = false;
  (__return_storage_ptr__->Details).Logjam = false;
  (__return_storage_ptr__->Details).ChaCha20Preference = false;
  (__return_storage_ptr__->Details).HstsPolicy.LONG_MAX_AGE = 0;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HstsPolicy.Header);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HstsPolicy.Status);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HstsPolicy.Error);
  (__return_storage_ptr__->Details).HstsPolicy.MaxAge = 0;
  (__return_storage_ptr__->Details).HstsPolicy.IncludeSubDomains = false;
  (__return_storage_ptr__->Details).HstsPolicy.Preload = false;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = (_Base_ptr)0x0;
  (__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->Details).HstsPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&(__return_storage_ptr__->Details).HstsPolicy.Directives);
  (__return_storage_ptr__->Details).HstsPreloads.
  super__Vector_base<ssllabs::labsHstsPreload,_std::allocator<ssllabs::labsHstsPreload>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HstsPreloads.
  super__Vector_base<ssllabs::labsHstsPreload,_std::allocator<ssllabs::labsHstsPreload>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HstsPreloads.
  super__Vector_base<ssllabs::labsHstsPreload,_std::allocator<ssllabs::labsHstsPreload>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsHstsPreload,_std::allocator<ssllabs::labsHstsPreload>_>::vector
            (&(__return_storage_ptr__->Details).HstsPreloads);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpPolicy);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpPolicy.Status);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpPolicy.Error);
  (__return_storage_ptr__->Details).HpkpPolicy.MaxAge = 0;
  (__return_storage_ptr__->Details).HpkpPolicy.IncludeSubDomains = false;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpPolicy.ReportUri);
  (__return_storage_ptr__->Details).HpkpPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>::vector
            (&(__return_storage_ptr__->Details).HpkpPolicy.Pins);
  (__return_storage_ptr__->Details).HpkpPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>::vector
            (&(__return_storage_ptr__->Details).HpkpPolicy.MatchedPins);
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = (_Base_ptr)0x0;
  (__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->Details).HpkpPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&(__return_storage_ptr__->Details).HpkpPolicy.Directives);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpRoPolicy);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpRoPolicy.Status);
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpRoPolicy.Error);
  (__return_storage_ptr__->Details).HpkpRoPolicy.MaxAge = 0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.IncludeSubDomains = false;
  std::__cxx11::string::string((string *)&(__return_storage_ptr__->Details).HpkpRoPolicy.ReportUri);
  (__return_storage_ptr__->Details).HpkpRoPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Pins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>::vector
            (&(__return_storage_ptr__->Details).HpkpRoPolicy.Pins);
  (__return_storage_ptr__->Details).HpkpRoPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.MatchedPins.
  super__Vector_base<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ssllabs::labsHpkpPin,_std::allocator<ssllabs::labsHpkpPin>_>::vector
            (&(__return_storage_ptr__->Details).HpkpRoPolicy.MatchedPins);
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = (_Base_ptr)0x0;
  (__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->Details).HpkpRoPolicy.Directives._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&(__return_storage_ptr__->Details).HpkpRoPolicy.Directives);
  (__return_storage_ptr__->Details).DrownErrors = false;
  (__return_storage_ptr__->Details).DrownVulnerable = false;
  parseEndpointData(obj,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

labsEndpoint_t Endpoint::parseEndpointData(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> &obj) {
        labsEndpoint_t endpoint = {};

        parseEndpointData(obj, endpoint);
        return endpoint;
    }